

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::handleIndexLimits
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base,TIntermTyped *index)

{
  pointer *pppTVar1;
  uint uVar2;
  iterator __position;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TLimits *pTVar5;
  undefined4 extraout_var_02;
  long lVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermTyped *local_20;
  
  pTVar5 = this->limits;
  local_20 = index;
  if (pTVar5->generalSamplerIndexing == false) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
    if (iVar4 == 0xe) goto LAB_004a114c;
    pTVar5 = this->limits;
  }
  if (pTVar5->generalUniformIndexing == false) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
    if ((0xfffffffd < (*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) - 7) &&
       ((this->super_TParseContextBase).super_TParseVersions.language != EShLangVertex))
    goto LAB_004a114c;
    pTVar5 = this->limits;
  }
  if (pTVar5->generalAttributeMatrixVectorIndexing == false) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
    uVar2 = *(uint *)(CONCAT44(extraout_var_00,iVar4) + 8);
    if ((((uVar2 & 0x7f) < 0x1c) && ((0xe300008U >> (uVar2 & 0x1f) & 1) != 0)) &&
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex)) {
      iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0xe0))
                        ((long *)CONCAT44(extraout_var_06,iVar4));
      if (cVar3 != '\0') goto LAB_004a114c;
      iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0xd8))
                        ((long *)CONCAT44(extraout_var_07,iVar4));
      if (cVar3 != '\0') goto LAB_004a114c;
    }
  }
  pTVar5 = this->limits;
  if (pTVar5->generalConstantMatrixVectorIndexing == false) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[5])(base);
    if (CONCAT44(extraout_var_01,iVar4) != 0) goto LAB_004a114c;
    pTVar5 = this->limits;
  }
  if (pTVar5->generalVariableIndexing == false) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_02,iVar4));
    if (1 < (*(uint *)(lVar6 + 8) & 0x7f) - 5) {
      iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x58))
                        ((long *)CONCAT44(extraout_var_03,iVar4));
      if ((0x1b < (*(uint *)(lVar6 + 8) & 0x7f)) ||
         ((0xe300008U >> (*(uint *)(lVar6 + 8) & 0x1f) & 1) == 0)) {
        iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x58))
                          ((long *)CONCAT44(extraout_var_08,iVar4));
        if ((0x1e < (*(uint *)(lVar6 + 8) & 0x7f)) ||
           ((0x71c00010U >> (*(uint *)(lVar6 + 8) & 0x1f) & 1) == 0)) {
          iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
          lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0x58))
                            ((long *)CONCAT44(extraout_var_09,iVar4));
          if ((*(ulong *)(lVar6 + 8) & 0x10000007f) != 2 && (*(ulong *)(lVar6 + 8) >> 0x20 & 1) == 0
             ) goto LAB_004a114c;
        }
      }
    }
  }
  if (this->limits->generalVaryingIndexing != false) {
    return;
  }
  iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var_04,iVar4));
  if ((0x1b < (*(uint *)(lVar6 + 8) & 0x7f)) ||
     ((0xe300008U >> (*(uint *)(lVar6 + 8) & 0x1f) & 1) == 0)) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_05,iVar4));
    if (0x1e < (*(uint *)(lVar6 + 8) & 0x7f)) {
      return;
    }
    if ((0x71c00010U >> (*(uint *)(lVar6 + 8) & 0x1f) & 1) == 0) {
      return;
    }
  }
LAB_004a114c:
  __position._M_current =
       (this->needsIndexLimitationChecking).
       super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
       super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->needsIndexLimitationChecking).
      super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
      super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>::
    _M_realloc_insert<glslang::TIntermTyped*const&>
              ((vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>> *)
               &this->needsIndexLimitationChecking,__position,&local_20);
  }
  else {
    *__position._M_current = index;
    pppTVar1 = &(this->needsIndexLimitationChecking).
                super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                .
                super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void TParseContext::handleIndexLimits(const TSourceLoc& /*loc*/, TIntermTyped* base, TIntermTyped* index)
{
    if ((! limits.generalSamplerIndexing && base->getBasicType() == EbtSampler) ||
        (! limits.generalUniformIndexing && base->getQualifier().isUniformOrBuffer() && language != EShLangVertex) ||
        (! limits.generalAttributeMatrixVectorIndexing && base->getQualifier().isPipeInput() && language == EShLangVertex && (base->getType().isMatrix() || base->getType().isVector())) ||
        (! limits.generalConstantMatrixVectorIndexing && base->getAsConstantUnion()) ||
        (! limits.generalVariableIndexing && ! base->getType().getQualifier().isUniformOrBuffer() &&
                                             ! base->getType().getQualifier().isPipeInput() &&
                                             ! base->getType().getQualifier().isPipeOutput() &&
                                             ! base->getType().getQualifier().isConstant()) ||
        (! limits.generalVaryingIndexing && (base->getType().getQualifier().isPipeInput() ||
                                                base->getType().getQualifier().isPipeOutput()))) {
        // it's too early to know what the inductive variables are, save it for post processing
        needsIndexLimitationChecking.push_back(index);
    }
}